

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckCount(RtreeCheck *pCheck,char *zTbl,i64 nExpect)

{
  int iVar1;
  int iVar2;
  sqlite3_stmt *psVar3;
  sqlite3_stmt *in_RDX;
  undefined8 in_RSI;
  RtreeCheck *in_RDI;
  i64 nActual;
  sqlite3_stmt *pCount;
  undefined8 in_stack_ffffffffffffffd8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if ((in_RDI->rc == 0) &&
     (psVar3 = rtreeCheckPrepare(in_RDI,"SELECT count(*) FROM %Q.\'%q%s\'",in_RDI->zDb,in_RDI->zTab,
                                 in_RSI), psVar3 != (sqlite3_stmt *)0x0)) {
    iVar1 = sqlite3_step(pCount);
    if ((iVar1 == 100) &&
       (psVar3 = (sqlite3_stmt *)sqlite3_column_int64(psVar3,iVar2), psVar3 != in_RDX)) {
      rtreeCheckAppendMsg(in_RDI,
                          "Wrong number of entries in %%%s table - expected %lld, actual %lld",
                          in_RSI,in_RDX,psVar3);
    }
    iVar2 = sqlite3_finalize(in_RDX);
    in_RDI->rc = iVar2;
  }
  return;
}

Assistant:

static void rtreeCheckCount(RtreeCheck *pCheck, const char *zTbl, i64 nExpect){
  if( pCheck->rc==SQLITE_OK ){
    sqlite3_stmt *pCount;
    pCount = rtreeCheckPrepare(pCheck, "SELECT count(*) FROM %Q.'%q%s'",
        pCheck->zDb, pCheck->zTab, zTbl
    );
    if( pCount ){
      if( sqlite3_step(pCount)==SQLITE_ROW ){
        i64 nActual = sqlite3_column_int64(pCount, 0);
        if( nActual!=nExpect ){
          rtreeCheckAppendMsg(pCheck, "Wrong number of entries in %%%s table"
              " - expected %lld, actual %lld" , zTbl, nExpect, nActual
          );
        }
      }
      pCheck->rc = sqlite3_finalize(pCount);
    }
  }
}